

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::logResults(MakeCurrentPerfCase *this)

{
  undefined8 uVar1;
  unsigned_long uVar2;
  int iVar3;
  TestLog *this_00;
  pointer puVar4;
  TestContext *this_01;
  SampleBuilder *this_02;
  size_t in_RCX;
  string *unit;
  ulong uVar5;
  int sampleNdx_2;
  int precision;
  void *__buf;
  void *__buf_00;
  ulong uVar6;
  long lVar7;
  int sampleNdx;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  float local_2c8;
  float local_2c4;
  float local_2c0;
  allocator<char> local_2b5;
  allocator<char> local_2b4;
  allocator<char> local_2b3;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  float local_2b0;
  float local_2ac;
  double local_2a8;
  double dStack_2a0;
  ScopedLogSection section;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  LogSampleList local_1f0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&section,"Result",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Result",&local_2b2);
  tcu::LogSampleList::LogSampleList(&local_1f0,(string *)&section,&local_250);
  tcu::LogSampleList::write(&local_1f0,(int)this_00,__buf,in_RCX);
  tcu::TestLog::startSampleInfo(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Time",&local_2b3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Time",&local_2b4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"us",&local_2b5);
  unit = &local_230;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_1b0,&local_270,&local_210,unit,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)local_1b0,(int)this_00,__buf_00,(size_t)unit);
  tcu::TestLog::endSampleInfo(this_00);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_270);
  tcu::LogSampleList::~LogSampleList(&local_1f0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&section);
  for (lVar7 = 0;
      puVar4 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar7 < (int)((ulong)((long)(this->m_samples).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 3);
      lVar7 = lVar7 + 1) {
    local_1a8._0_8_ = (pointer)0x0;
    local_1a8._8_8_ = 0;
    local_1a8._16_8_ = 0;
    local_1b0 = (undefined1  [8])this_00;
    this_02 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_1b0,puVar4[lVar7]);
    tcu::SampleBuilder::operator<<(this_02,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)local_1a8);
  }
  tcu::TestLog::endSampleList(this_00);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  puVar4 = (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
  iVar3 = (this->m_spec).iterationCount;
  uVar8 = 0;
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = uVar6 & 0xffffffff;
  }
  lVar7 = 0;
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    lVar7 = lVar7 + puVar4[uVar8];
  }
  lVar9 = (long)iVar3 * uVar5;
  auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  dStack_2a0 = auVar11._8_8_ - 1.9342813113834067e+25;
  auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar12._0_8_ = lVar9;
  auVar12._12_4_ = 0x45300000;
  uVar1 = *(undefined8 *)((long)puVar4 + (uVar6 & 0xfffffffffffffffe) * 4);
  auVar19._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._12_4_ = 0x45300000;
  dVar10 = (double)iVar3;
  fVar13 = (float)(((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar10);
  local_2a8 = (dStack_2a0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
              ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
  local_2c8 = 0.0;
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    uVar2 = puVar4[uVar8];
    auVar15._8_4_ = (int)(uVar2 >> 0x20);
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    fVar14 = (float)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar10) -
             fVar13;
    local_2c8 = local_2c8 + fVar14 * fVar14;
  }
  local_2c4 = 0.0;
  local_2c0 = 3.4028235e+38;
  for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    uVar2 = puVar4[uVar8];
    auVar16._8_4_ = (int)(uVar2 >> 0x20);
    auVar16._0_8_ = uVar2;
    auVar16._12_4_ = 0x45300000;
    fVar14 = (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar10);
    fVar18 = fVar14;
    if (local_2c0 <= fVar14) {
      fVar18 = local_2c0;
    }
    if (fVar14 <= local_2c4) {
      fVar14 = local_2c4;
    }
    local_2c4 = fVar14;
    local_2c0 = fVar18;
  }
  local_2ac = (float)uVar6;
  local_2c8 = local_2c8 / local_2ac;
  local_2b0 = 0.0;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = puVar4[uVar6];
    auVar17._8_4_ = (int)(uVar2 >> 0x20);
    auVar17._0_8_ = uVar2;
    auVar17._12_4_ = 0x45300000;
    local_2b0 = ((float)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar10) -
                fVar13) / local_2c8;
    local_2b0 = local_2b0 * local_2b0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"Result",(allocator<char> *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Statistics from results.",(allocator<char> *)&local_270);
  tcu::ScopedLogSection::ScopedLogSection(&section,this_00,(string *)local_1b0,&local_1f0.m_name);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)local_1b0);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Total time: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Mean: ");
  fVar14 = (float)local_2a8;
  local_2a8 = (double)CONCAT44(local_2a8._4_4_,fVar14);
  std::ostream::operator<<((ostringstream *)local_1a8,fVar14);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Median: ");
  std::ostream::operator<<((ostringstream *)local_1a8,fVar13);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Variance: ");
  std::ostream::operator<<((ostringstream *)local_1a8,local_2c8);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Skewness: ");
  std::ostream::operator<<((ostringstream *)local_1a8,local_2b0 / local_2ac);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Min: ");
  std::ostream::operator<<((ostringstream *)local_1a8,local_2c0);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  local_1b0 = (undefined1  [8])this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Max: ");
  std::ostream::operator<<((ostringstream *)local_1a8,local_2c4);
  std::operator<<((ostream *)local_1a8,"us");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_((string *)local_1b0,(de *)0x2,local_2a8._0_4_,precision);
  tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  return;
}

Assistant:

void MakeCurrentPerfCase::logResults (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::SampleList("Result", "Result")
		<< TestLog::SampleInfo << TestLog::ValueInfo("Time", "Time", "us", QP_SAMPLE_VALUE_TAG_RESPONSE)
		<< TestLog::EndSampleInfo;

	for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		log << TestLog::Sample << deInt64(m_samples[sampleNdx]) << TestLog::EndSample;

	log << TestLog::EndSampleList;

	// Log stats
	{
		deUint64	totalTimeUs				= 0;
		deUint64	totalIterationCount		= 0;

		float		iterationTimeMeanUs		= 0.0f;
		float		iterationTimeMedianUs	= 0.0f;
		float		iterationTimeVarianceUs	= 0.0f;
		float		iterationTimeSkewnessUs	= 0.0f;
		float		iterationTimeMinUs		= std::numeric_limits<float>::max();
		float		iterationTimeMaxUs		= 0.0f;

		std::sort(m_samples.begin(), m_samples.end());

		// Calculate totals
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			totalTimeUs			+= m_samples[sampleNdx];
			totalIterationCount	+= m_spec.iterationCount;
		}

		// Calculate mean and median
		iterationTimeMeanUs		= ((float)(((double)totalTimeUs) / (double)totalIterationCount));
		iterationTimeMedianUs	= ((float)(((double)m_samples[m_samples.size() / 2]) / (double)m_spec.iterationCount));

		// Calculate variance
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeVarianceUs	+= std::pow(iterationTimeUs - iterationTimeMedianUs, 2.0f);
		}

		// Calculate min and max
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeMinUs		= std::min<float>(iterationTimeMinUs, iterationTimeUs);
			iterationTimeMaxUs		= std::max<float>(iterationTimeMaxUs, iterationTimeUs);
		}

		iterationTimeVarianceUs /= (float)m_samples.size();

		// Calculate skewness
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeSkewnessUs	= std::pow((iterationTimeUs - iterationTimeMedianUs) / iterationTimeVarianceUs, 2.0f);
		}

		iterationTimeSkewnessUs /= (float)m_samples.size();

		{
			tcu::ScopedLogSection	section(log, "Result", "Statistics from results.");

			log << TestLog::Message << "Total time: "	<< totalTimeUs				<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Mean: "			<< iterationTimeMeanUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Median: "		<< iterationTimeMedianUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Variance: "		<< iterationTimeVarianceUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Skewness: "		<< iterationTimeSkewnessUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Min: "			<< iterationTimeMinUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Max: "			<< iterationTimeMaxUs		<< "us" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(((double)totalTimeUs)/(double)totalIterationCount), 2).c_str());
	}
}